

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_avx2.c
# Opt level: O1

parasail_profile_t *
parasail_profile_create_stats_avx_256_32(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  undefined8 *puVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  parasail_profile_t *ppVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  size_t size;
  byte *pbVar19;
  __m256i_32_t p;
  __m256i_32_t s;
  __m256i_32_t m;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  int iVar9;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_stats_avx_256_32_cold_2();
  }
  else if (s1 == (char *)0x0) {
    parasail_profile_create_stats_avx_256_32_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar2 = matrix->size;
    iVar9 = _s1Len + 0xe;
    if (-1 < _s1Len + 7) {
      iVar9 = _s1Len + 7;
    }
    uVar8 = iVar9 >> 3;
    size = (long)(int)(uVar8 * uVar2) << 5;
    pvVar3 = parasail_memalign(0x20,size);
    if ((((pvVar3 != (void *)0x0) && (pvVar4 = parasail_memalign(0x20,size), pvVar4 != (void *)0x0))
        && (pvVar5 = parasail_memalign(0x20,size), pvVar5 != (void *)0x0)) &&
       (ppVar6 = parasail_profile_new(s1,_s1Len,matrix), ppVar6 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar2) {
        uVar7 = 1;
        if (1 < (int)uVar8) {
          uVar7 = (ulong)uVar8;
        }
        uVar10 = 0;
        lVar14 = 0;
        do {
          if (0 < _s1Len) {
            lVar14 = (long)(int)lVar14;
            uVar15 = 0;
            do {
              iVar9 = matrix->type;
              lVar18 = 0;
              uVar17 = uVar15;
              do {
                iVar16 = (int)uVar17;
                if (iVar9 == 0) {
                  if (iVar16 < _s1Len) {
                    pbVar19 = (byte *)(s1 + uVar17);
                    uVar13 = uVar10;
                    goto LAB_0077ba5a;
                  }
LAB_0077ba7a:
                  iVar11 = 0;
                }
                else {
                  if (_s1Len <= iVar16) goto LAB_0077ba7a;
                  pbVar19 = (byte *)(matrix->alphabet + uVar10);
                  uVar13 = uVar17;
LAB_0077ba5a:
                  iVar11 = matrix->matrix
                           [(long)(int)((int)uVar13 * uVar2) + (long)matrix->mapper[*pbVar19]];
                }
                *(int *)((long)&local_c0 + lVar18 * 4) = iVar11;
                uVar12 = 0;
                if (iVar16 < _s1Len) {
                  uVar12 = (uint)(uVar10 == (uint)matrix->mapper[(byte)s1[uVar17]]);
                }
                *(uint *)((long)&local_80 + lVar18 * 4) = uVar12;
                *(uint *)((long)&local_a0 + lVar18 * 4) =
                     (uint)(0 < *(int *)((long)&local_c0 + lVar18 * 4));
                uVar17 = uVar17 + uVar8;
                lVar18 = lVar18 + 1;
              } while (lVar18 != 8);
              lVar18 = lVar14 * 0x20;
              puVar1 = (undefined8 *)((long)pvVar3 + lVar18);
              *puVar1 = local_c0;
              puVar1[1] = uStack_b8;
              puVar1[2] = uStack_b0;
              puVar1[3] = uStack_a8;
              puVar1 = (undefined8 *)((long)pvVar4 + lVar18);
              *puVar1 = local_80;
              puVar1[1] = uStack_78;
              puVar1[2] = uStack_70;
              puVar1[3] = uStack_68;
              puVar1 = (undefined8 *)((long)pvVar5 + lVar18);
              *puVar1 = local_a0;
              puVar1[1] = uStack_98;
              puVar1[2] = uStack_90;
              puVar1[3] = uStack_88;
              lVar14 = lVar14 + 1;
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar7);
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar2);
      }
      (ppVar6->profile32).score = pvVar3;
      (ppVar6->profile32).matches = pvVar4;
      (ppVar6->profile32).similar = pvVar5;
      ppVar6->free = parasail_free___m256i;
      return ppVar6;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_stats_avx_256_32(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0;
    const int32_t segWidth = 8; /* number of values in vector unit */
    int32_t segLen = 0;
    __m256i* restrict vProfile = NULL;
    __m256i* restrict vProfileM = NULL;
    __m256i* restrict vProfileS = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is required for both pssm and square */
    PARASAIL_CHECK_NULL(s1);

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size; /* number of amino acids in table */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m256i(32, n * segLen);
    if (!vProfile) return NULL;
    vProfileM = parasail_memalign___m256i(32, n * segLen);
    if (!vProfileM) return NULL;
    vProfileS = parasail_memalign___m256i(32, n * segLen);
    if (!vProfileS) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m256i_32_t p;
            __m256i_32_t m;
            __m256i_32_t s;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                m.v[segNum] = j >= s1Len ? 0 : (k == matrix->mapper[(unsigned char)s1[j]]);
                s.v[segNum] = p.v[segNum] > 0;
                j += segLen;
            }
            _mm256_store_si256(&vProfile[index], p.m);
            _mm256_store_si256(&vProfileM[index], m.m);
            _mm256_store_si256(&vProfileS[index], s.m);
            ++index;
        }
    }

    profile->profile32.score = vProfile;
    profile->profile32.matches = vProfileM;
    profile->profile32.similar = vProfileS;
    profile->free = &parasail_free___m256i;
    return profile;
}